

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O2

void interpolative_internal::encode_interpolative
               (bit_stream *os,uint32_t *in_buf,size_t n,size_t low,size_t high)

{
  ulong uVar1;
  ulong high_00;
  
  while (n != 0) {
    uVar1 = n + 1 >> 1;
    n = n - uVar1;
    high_00 = (ulong)(in_buf + uVar1)[-1];
    write_center_mid(os,high_00 + 2 + ((1 - uVar1) - low),(((high + 1) - low) - n) + (1 - uVar1));
    encode_interpolative(os,in_buf,uVar1 - 1,low,high_00);
    low = high_00 + 2;
    in_buf = in_buf + uVar1;
  }
  return;
}

Assistant:

static inline void encode_interpolative(bit_stream& os,
        const uint32_t* in_buf, size_t n, size_t low, size_t high)
    {
        if (n == 0ULL)
            return;
        uint64_t h = (n + 1ULL) >> 1ULL;
        uint64_t n1 = h - 1ULL;
        uint64_t n2 = n - h;
        uint64_t v = in_buf[h - 1ULL] + 1ULL; // we don't encode 0

        write_center_mid(os, v - low - n1 + 1ULL, high - n2 - low - n1 + 1ULL);

        encode_interpolative(os, in_buf, n1, low, v - 1ULL);
        encode_interpolative(os, in_buf + h, n2, v + 1ULL, high);
    }